

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O1

int __thiscall Display::plot(Display *this)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  pointer pPVar6;
  bool bVar7;
  long lVar8;
  ofstream *poVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  ostringstream command;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  poVar9 = this->pFile;
  if (poVar9 == (ofstream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"instruction file error",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    iVar4 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set title ",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar9,(this->sTitle)._M_dataplus._M_p,
                        (this->sTitle)._M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar9 = this->pFile;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set multiplot",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"set grid",8);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar6) {
      bVar7 = true;
      uVar11 = 0;
      uVar13 = 1;
      uVar3 = 0;
      do {
        uVar1 = pPVar6[uVar11].nMode;
        if ((uVar1 & 0x3e0) == (uVar3 & 0x3e0)) {
          if (bVar7) goto switchD_00129b04_default;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->pFile,", ",2);
          goto switchD_0012a120_caseD_3;
        }
        cVar2 = (char)this->pFile;
        std::ios::widen((char)*(undefined8 *)(*(long *)this->pFile + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        switch((uVar1 & 0x3e0) - 0x20 >> 5) {
        case 0:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"unset grid",10);
          pcVar10 = "set origin 0.5,0.5";
          break;
        case 1:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"unset grid",10);
          pcVar10 = "set origin 0.0,0.5";
          break;
        case 2:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"unset grid",10);
          pcVar10 = "set origin 0.5,0.0";
          break;
        case 3:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"unset grid",10);
          pcVar10 = "set origin 0.0,0.0";
          break;
        case 4:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set grid",8);
          pcVar10 = "set origin 0.0,0.0";
          goto LAB_00129bf8;
        case 5:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set grid",8);
          pcVar10 = "set origin 0.5,0.0";
LAB_00129bf8:
          pcVar12 = "set size 0.5,1.0";
          goto LAB_00129c27;
        case 6:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set grid",8);
          pcVar10 = "set origin 0.0,0.5";
          goto LAB_00129c20;
        case 7:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set grid",8);
          pcVar10 = "set origin 0.0,0.0";
LAB_00129c20:
          pcVar12 = "set size 1.0,0.5";
          goto LAB_00129c27;
        default:
          goto switchD_00129b04_default;
        }
        pcVar12 = "set size 0.5,0.5";
LAB_00129c27:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar10,0x12);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar12,0x10);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"clear",5);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
switchD_00129b04_default:
        poVar9 = this->pFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar9,"set xtics font \"",0x10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar9,(this->sXTicFont)._M_dataplus._M_p,
                            (this->sXTicFont)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar9 = this->pFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar9,"set ytics font \"",0x10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar9,(this->sYTicFont)._M_dataplus._M_p,
                            (this->sYTicFont)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar9 = this->pFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar9,"set ztics font \"",0x10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar9,(this->sZTicFont)._M_dataplus._M_p,
                            (this->sZTicFont)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar9 = this->pFile;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set xlabel \"",0xc);
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar9,pPVar6[uVar11].sXLabel._M_dataplus._M_p,
                            pPVar6[uVar11].sXLabel._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" font \"",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->sXFont)._M_dataplus._M_p,(this->sXFont)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar9 = this->pFile;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set ylabel \"",0xc);
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar9,pPVar6[uVar11].sYLabel._M_dataplus._M_p,
                            pPVar6[uVar11].sYLabel._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" font \"",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->sYFont)._M_dataplus._M_p,(this->sYFont)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar9 = this->pFile;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set zlabel \"",0xc);
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar9,pPVar6[uVar11].sZLabel._M_dataplus._M_p,
                            pPVar6[uVar11].sZLabel._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" font \"",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->sZFont)._M_dataplus._M_p,(this->sZFont)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this->pFile,(this->sUserSettings)._M_dataplus._M_p,
                            (this->sUserSettings)._M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this->pFile,pPVar6[uVar11].sUserSettings._M_dataplus._M_p,
                            pPVar6[uVar11].sUserSettings._M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        uVar3 = uVar1 & 0x1c00;
        if (uVar3 == 0x1000) {
          poVar9 = this->pFile;
          lVar8 = 0xe;
          pcVar10 = "set logscale z";
LAB_0012a0e1:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,pcVar10,lVar8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
        else {
          if (uVar3 == 0x800) {
            poVar9 = this->pFile;
            lVar8 = 0xf;
            pcVar10 = "set logscale y ";
            goto LAB_0012a0e1;
          }
          if (uVar3 == 0x400) {
            poVar9 = this->pFile;
            lVar8 = 0xe;
            pcVar10 = "set logscale x";
            goto LAB_0012a0e1;
          }
        }
        switch(uVar1 & 3) {
        case 0:
          poVar9 = this->pFile;
          lVar8 = 5;
          pcVar10 = "plot ";
          break;
        case 2:
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"set pm3d map",0xc);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        case 1:
          poVar9 = this->pFile;
          lVar8 = 6;
          pcVar10 = "splot ";
          break;
        case 3:
          goto switchD_0012a120_caseD_3;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,pcVar10,lVar8);
switchD_0012a120_caseD_3:
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this->pFile,pPVar6[uVar11].sFunction._M_dataplus._M_p,
                   pPVar6[uVar11].sFunction._M_string_length);
        if ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11].sUsedDimensions._M_string_length != 0) {
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9," using ",7);
          pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar9,pPVar6[uVar11].sUsedDimensions._M_dataplus._M_p,
                     pPVar6[uVar11].sUsedDimensions._M_string_length);
        }
        poVar9 = this->pFile;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9," title \" ",9);
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar9,pPVar6[uVar11].sName._M_dataplus._M_p,
                            pPVar6[uVar11].sName._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
        switch(uVar1 >> 2 & 7) {
        case 0:
          poVar9 = this->pFile;
          lVar8 = 0xb;
          pcVar10 = "with lines ";
          break;
        case 1:
          poVar9 = this->pFile;
          lVar8 = 0xc;
          pcVar10 = "with points ";
          break;
        case 2:
          poVar9 = this->pFile;
          lVar8 = 10;
          pcVar10 = "with dots ";
          break;
        case 3:
          poVar9 = this->pFile;
          lVar8 = 0xb;
          pcVar10 = "with image ";
          break;
        case 4:
          poVar9 = this->pFile;
          lVar8 = 0xb;
          pcVar10 = "with boxes ";
          break;
        case 5:
          poVar9 = this->pFile;
          lVar8 = 0x16;
          pcVar10 = "with filledcurves y1=0";
          break;
        case 6:
          poVar9 = this->pFile;
          lVar8 = 0x11;
          pcVar10 = "with linespoints ";
          break;
        case 7:
          poVar9 = this->pFile;
          lVar8 = 1;
          pcVar10 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,pcVar10,lVar8);
        if ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11].nLineStyle != 0) {
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"ls ",3);
          std::ostream::operator<<
                    (poVar9,(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11].nLineStyle);
        }
        if ((this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11].nLineWidth != 0) {
          poVar9 = this->pFile;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"lw ",3);
          std::ostream::operator<<
                    (poVar9,(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11].nLineWidth);
        }
        pPVar6 = (this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = ((long)(this->vPlots).super__Vector_base<Plot,_std::allocator<Plot>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) * -0x1111111111111111
        ;
        bVar7 = false;
        bVar14 = uVar13 <= uVar11;
        lVar8 = uVar11 - uVar13;
        uVar11 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
        uVar3 = uVar1;
      } while (bVar14 && lVar8 != 0);
    }
    cVar2 = (char)this->pFile;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->pFile + -0x18) + cVar2);
    std::ostream::put(cVar2);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"unset multiplot",0xf);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ostream::flush();
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)local_1a8,(string *)local_1c8,_S_out);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"/usr/bin/gnuplot ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"-xrm \"gnuplot*background:#e0e0a0\" ",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"-xrm \"gnuplot*line1Color:blue\" ",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"-xrm \"gnuplot*line2Color:red\" ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"-xrm \"gnuplot*line3Color:darkgrey\" ",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"-persist -title \"NeuroLab :: Plot\" ",0x23);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->sFileBase)._M_dataplus._M_p,
                        (this->sFileBase)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".gnuplot",8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    system((char *)local_1c8[0]);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Display::plot()
{
	// sort plot vector by plot-mode
	// not implemented yet
	if(pFile) {
		int mode = 0; // start with default mode
		int oldMode = 0; // to detect mode changes -> set different coordinates for subplots
		bool firstPlot = true; // the first plot get a different command
		
		(*pFile) << "set title " << sTitle << endl;
		(*pFile) << "set multiplot" << endl << "set grid" << endl;
		for(uint i=0; i<vPlots.size(); i++) {
			mode = vPlots[i].nMode;
			
			// set new position when changed
			if( (mode & DSP_POSITION_MASK) != (oldMode & DSP_POSITION_MASK) ) {
				(*pFile) << endl;
				switch( mode & DSP_POSITION_MASK ) {
					case DSP_TOP_LEFT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.0,0.5" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_TOP_RIGHT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.5,0.5" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM_LEFT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM_RIGHT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.5,0.0" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_TOP:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.5" << endl
							<< "set size 1.0,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 1.0,0.5" << endl << "clear" << endl;
						break;
					case DSP_LEFT:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 0.5,1.0" << endl << "clear" << endl;
						break;
					case DSP_RIGHT:
						(*pFile) << "set grid" << endl
							<< "set origin 0.5,0.0" << endl
							<< "set size 0.5,1.0" << endl << "clear" << endl;
						break;
				}
				firstPlot = true;
			}
			
			// append next plot
			if( firstPlot ) {
				(*pFile) << "set xtics font \"" << sXTicFont << "\"" << endl;
				(*pFile) << "set ytics font \"" << sYTicFont << "\"" << endl;
				(*pFile) << "set ztics font \"" << sZTicFont << "\"" << endl;
				(*pFile) << "set xlabel \"" << vPlots[i].sXLabel << "\" font \"" << sXFont << "\"" << endl;
				(*pFile) << "set ylabel \"" << vPlots[i].sYLabel << "\" font \"" << sYFont << "\"" << endl;
				(*pFile) << "set zlabel \"" << vPlots[i].sZLabel << "\" font \"" << sZFont << "\"" << endl;
				(*pFile) << sUserSettings << endl;
				(*pFile) << vPlots[i].sUserSettings << endl;
				switch(mode & (DSP_AXIS_MASK) ) {
					case DSP_X_AXIS_LOG:
						(*pFile) << "set logscale x" << endl;
						break;
					case DSP_Y_AXIS_LOG:
						(*pFile) << "set logscale y " << endl;
						break;
					case DSP_Z_AXIS_LOG:
						(*pFile) << "set logscale z" << endl;
				}
				switch(mode & (DSP_DIMENSION_MASK|DSP_COLOR_MASK)) {
					case DSP_3D:
						(*pFile) << "set pm3d map" << endl;
						(*pFile) << "splot ";
						break;
					case DSP_BW:;
						(*pFile) << "splot ";
						break;
					case DSP_2D:
						(*pFile) << "plot ";
				}
			} else 
				(*pFile) << ", ";
			
			(*pFile) << vPlots[i].sFunction;
			if (vPlots[i].sUsedDimensions.length() > 0)
				(*pFile) << " using " <<  vPlots[i].sUsedDimensions;
			(*pFile) <<  " title \" " << vPlots[i].sName << "\" " ;
			
			switch(mode & DSP_LINE_MASK) {
				case DSP_LINES:
					(*pFile) << "with lines "; 
					break;
				case DSP_POINTS:
					(*pFile) << "with points "; 
					break;
				case DSP_DOTS:
					(*pFile) << "with dots "; 
					break;
                case DSP_IMAGE:
                    (*pFile) << "with image ";
                    break;
                case DSP_BARS:
					(*pFile) << "with boxes "; 
					break;
				case DSP_FILLEDCURVES:
					(*pFile) << "with filledcurves y1=0";
					break;
				case DSP_LINESPOINTS:
					(*pFile) << "with linespoints ";
					break;
				case DSP_NOLINES:
					(*pFile) << " ";
			}
			if (vPlots[i].nLineStyle)
				(*pFile) << "ls " << vPlots[i].nLineStyle;
            if (vPlots[i].nLineWidth)
                (*pFile) << "lw " << vPlots[i].nLineWidth;
            firstPlot = false;
			oldMode = mode;
		}
		(*pFile) << endl << "unset multiplot" << endl;
		(*pFile) << flush;
		
        // run terminal + gnuplStyleStyleot
		ostringstream command("");
		command << GNUPLOT_EXECUTABLE
			<< "-xrm \"gnuplot*background:#e0e0a0\" "
			<< "-xrm \"gnuplot*line1Color:blue\" "
			<< "-xrm \"gnuplot*line2Color:red\" "
			<< "-xrm \"gnuplot*line3Color:darkgrey\" "
			<< "-persist -title \"NeuroLab :: Plot\" ";
//		command << "/usr/bin/gnuplot -title \"NeuroLab :: Plot\" ";
		command << sFileBase << ".gnuplot" << flush;
		system( command.str().c_str() );
		return 0;
	}
	else cout << "instruction file error" << endl;
	return 1;
}